

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_checked.hh
# Opt level: O0

Roaring * __thiscall doublechecked::Roaring::operator|=(Roaring *this,Roaring *r)

{
  iterator __first;
  _Rb_tree_const_iterator<unsigned_int> in_RDI;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  *in_stack_ffffffffffffffc8;
  Roaring *in_stack_ffffffffffffffd0;
  _Base_ptr *this_00;
  
  roaring::Roaring::operator|=(in_stack_ffffffffffffffd0,(Roaring *)in_stack_ffffffffffffffc8);
  this_00 = &in_RDI._M_node[1]._M_parent;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
            (in_stack_ffffffffffffffc8);
  __first = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                      (in_stack_ffffffffffffffc8);
  std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>::
  insert<std::_Rb_tree_const_iterator<unsigned_int>>
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)this_00,
             (_Rb_tree_const_iterator<unsigned_int>)__first._M_node,in_RDI);
  return (Roaring *)in_RDI._M_node;
}

Assistant:

Roaring &operator|=(const Roaring &r) {
        plain |= r.plain;

        check.insert(r.check.begin(), r.check.end());  // won't add duplicates

        return *this;
    }